

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O1

void __thiscall Catch::TestSpecParser::processNameChar(TestSpecParser *this,char c)

{
  int iVar1;
  
  if (c == '[') {
    iVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                      (&this->m_substring,"exclude:");
    if (iVar1 == 0) {
      this->m_exclusion = true;
    }
    else {
      endMode(this);
    }
    this->m_mode = Tag;
  }
  return;
}

Assistant:

void TestSpecParser::processNameChar(char c) {
        if (c == '[') {
            if (m_substring == "exclude:")
                m_exclusion = true;
            else
                endMode();
            startNewMode(Tag);
        }
    }